

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less_equal *comp)

{
  char cVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  xpath_node *na;
  xpath_allocator_capture *this;
  xpath_memory_block *na_00;
  bool bVar5;
  xpath_string xVar6;
  xpath_allocator_capture cr;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  xpath_allocator_capture cri;
  xpath_allocator_capture crii;
  xpath_allocator_capture local_b8;
  xpath_allocator *local_a0;
  xpath_memory_block *local_98;
  xpath_memory_block *pxStack_90;
  xpath_node_set_raw local_80;
  xpath_allocator_capture local_60;
  xpath_allocator_capture local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      local_b8._target = stack->result;
      local_b8._state._root = (local_b8._target)->_root;
      local_b8._state._root_size = (local_b8._target)->_root_size;
      eval_node_set(&local_80,lhs,c,stack);
      eval_node_set((xpath_node_set_raw *)&local_a0,rhs,c,stack);
      for (na = local_80._begin; bVar5 = na != local_80._end, bVar5; na = na + 1) {
        local_60._target = stack->result;
        local_60._state._root = (local_60._target)->_root;
        local_60._state._root_size = (local_60._target)->_root_size;
        xVar6 = string_value(na,local_60._target);
        dVar3 = convert_string_to_number(xVar6._buffer);
        na_00 = local_98;
        while (na_00 != pxStack_90) {
          local_48._target = stack->result;
          local_48._state._root = (local_48._target)->_root;
          local_48._state._root_size = (local_48._target)->_root_size;
          xVar6 = string_value((xpath_node *)na_00,local_48._target);
          dVar4 = convert_string_to_number(xVar6._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_48);
          na_00 = (xpath_memory_block *)(na_00->data + 8);
          if (dVar3 <= dVar4) {
            xpath_allocator_capture::~xpath_allocator_capture(&local_60);
            goto LAB_0011ffc9;
          }
        }
        xpath_allocator_capture::~xpath_allocator_capture(&local_60);
      }
LAB_0011ffc9:
      this = &local_b8;
    }
    else {
      if (cVar1 == '\x01' || cVar2 != '\x01') {
        if ((cVar1 != '\x01') || (cVar2 == '\x01')) {
          __assert_fail("!\"Wrong types\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                        ,0x1d8b,
                        "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less_equal]"
                       );
        }
        local_a0 = stack->result;
        local_98 = local_a0->_root;
        pxStack_90 = (xpath_memory_block *)local_a0->_root_size;
        eval_node_set(&local_80,lhs,c,stack);
        dVar3 = eval_number(rhs,c,stack);
        do {
          bVar5 = local_80._begin != local_80._end;
          if (local_80._begin == local_80._end) break;
          local_b8._target = stack->result;
          local_b8._state._root = (local_b8._target)->_root;
          local_b8._state._root_size = (local_b8._target)->_root_size;
          xVar6 = string_value(local_80._begin,local_b8._target);
          dVar4 = convert_string_to_number(xVar6._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_b8);
          local_80._begin = local_80._begin + 1;
        } while (dVar3 < dVar4);
      }
      else {
        local_a0 = stack->result;
        local_98 = local_a0->_root;
        pxStack_90 = (xpath_memory_block *)local_a0->_root_size;
        dVar3 = eval_number(lhs,c,stack);
        eval_node_set(&local_80,rhs,c,stack);
        do {
          bVar5 = local_80._begin != local_80._end;
          if (local_80._begin == local_80._end) break;
          local_b8._target = stack->result;
          local_b8._state._root = (local_b8._target)->_root;
          local_b8._state._root_size = (local_b8._target)->_root_size;
          xVar6 = string_value(local_80._begin,local_b8._target);
          dVar4 = convert_string_to_number(xVar6._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_b8);
          local_80._begin = local_80._begin + 1;
        } while (dVar4 < dVar3);
      }
      this = (xpath_allocator_capture *)&local_a0;
    }
    xpath_allocator_capture::~xpath_allocator_capture(this);
  }
  else {
    dVar3 = eval_number(lhs,c,stack);
    dVar4 = eval_number(rhs,c,stack);
    bVar5 = dVar3 <= dVar4;
  }
  return bVar5;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(!"Wrong types");
				return false;
			}
		}